

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
diligent_spirv_cross::Compiler::BufferAccessHandler::handle
          (BufferAccessHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  SPIRConstant *this_00;
  size_t sVar4;
  int iVar5;
  value_type *__x;
  BufferRange local_88;
  ulong local_70;
  size_t range;
  SPIRType *pSStack_60;
  uint32_t offset;
  SPIRType *type;
  _Node_iterator_base<unsigned_int,_false> local_48;
  _Node_iterator_base<unsigned_int,_false> local_40;
  undefined1 local_34 [8];
  uint32_t index;
  bool ptr_chain;
  uint32_t *puStack_28;
  uint32_t length_local;
  uint32_t *args_local;
  BufferAccessHandler *pBStack_18;
  Op opcode_local;
  BufferAccessHandler *this_local;
  
  if (((opcode == OpAccessChain) || (opcode == OpInBoundsAccessChain)) ||
     (opcode == OpPtrAccessChain)) {
    local_34[7] = opcode == OpPtrAccessChain;
    uVar2 = 4;
    if ((bool)local_34[7]) {
      uVar2 = 5;
    }
    if (length < uVar2) {
      this_local._7_1_ = false;
    }
    else if (args[2] == this->id) {
      iVar5 = 3;
      if ((bool)local_34[7]) {
        iVar5 = 4;
      }
      index = length;
      puStack_28 = args;
      args_local._4_4_ = opcode;
      pBStack_18 = this;
      this_00 = get<diligent_spirv_cross::SPIRConstant>(this->compiler,args[iVar5]);
      local_34._0_4_ = SPIRConstant::scalar(this_00,0,0);
      local_40._M_cur =
           (__node_type *)
           ::std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::find(&this->seen,(key_type *)local_34);
      local_48._M_cur =
           (__node_type *)
           ::std::
           end<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                     (&this->seen);
      bVar1 = ::std::__detail::operator!=(&local_40,&local_48);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        type = (SPIRType *)
               ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                        &this->seen,
                        (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)local_34,__x);
        pSStack_60 = expression_type(this->compiler,this->id);
        range._4_4_ = type_struct_member_offset(this->compiler,pSStack_60,local_34._0_4_);
        uVar2 = local_34._0_4_ + 1;
        sVar4 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::size
                          (&(pSStack_60->member_types).
                            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                          );
        if (uVar2 < sVar4) {
          uVar3 = type_struct_member_offset(this->compiler,pSStack_60,local_34._0_4_ + 1);
          local_70 = (ulong)(uVar3 - range._4_4_);
        }
        else {
          local_70 = get_declared_struct_member_size(this->compiler,pSStack_60,local_34._0_4_);
        }
        local_88.index = local_34._0_4_;
        local_88.offset = (size_t)range._4_4_;
        local_88.range = local_70;
        SmallVector<diligent_spirv_cross::BufferRange,_8UL>::push_back(this->ranges,&local_88);
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::BufferAccessHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	if (opcode != OpAccessChain && opcode != OpInBoundsAccessChain && opcode != OpPtrAccessChain)
		return true;

	bool ptr_chain = (opcode == OpPtrAccessChain);

	// Invalid SPIR-V.
	if (length < (ptr_chain ? 5u : 4u))
		return false;

	if (args[2] != id)
		return true;

	// Don't bother traversing the entire access chain tree yet.
	// If we access a struct member, assume we access the entire member.
	uint32_t index = compiler.get<SPIRConstant>(args[ptr_chain ? 4 : 3]).scalar();

	// Seen this index already.
	if (seen.find(index) != end(seen))
		return true;
	seen.insert(index);

	auto &type = compiler.expression_type(id);
	uint32_t offset = compiler.type_struct_member_offset(type, index);

	size_t range;
	// If we have another member in the struct, deduce the range by looking at the next member.
	// This is okay since structs in SPIR-V can have padding, but Offset decoration must be
	// monotonically increasing.
	// Of course, this doesn't take into account if the SPIR-V for some reason decided to add
	// very large amounts of padding, but that's not really a big deal.
	if (index + 1 < type.member_types.size())
	{
		range = compiler.type_struct_member_offset(type, index + 1) - offset;
	}
	else
	{
		// No padding, so just deduce it from the size of the member directly.
		range = compiler.get_declared_struct_member_size(type, index);
	}

	ranges.push_back({ index, offset, range });
	return true;
}